

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall TPZMatrix<long_double>::Decompose_Cholesky(TPZMatrix<long_double> *this)

{
  _func_int *p_Var1;
  char cVar2;
  int iVar3;
  int extraout_var;
  undefined8 in_R8;
  undefined8 in_R9;
  int64_t k;
  long lVar5;
  long lVar6;
  long lVar7;
  longdouble in_ST0;
  longdouble lVar8;
  longdouble lVar9;
  longdouble in_ST1;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST2;
  longdouble lVar12;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble local_78;
  longdouble local_68;
  long local_50;
  long local_48;
  longdouble local_3c;
  long lVar4;
  
  cVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  if ((cVar2 != '\0') && (cVar2 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
    cVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (cVar2 == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    lVar4 = CONCAT44(extraout_var,iVar3);
    local_50 = 0;
    if (lVar4 != 0 && -1 < extraout_var) {
      local_50 = lVar4;
    }
    local_3c = (longdouble)1e-16;
    lVar5 = 0;
    lVar10 = in_ST6;
    while (lVar7 = lVar5, lVar7 != local_50) {
      lVar8 = in_ST1;
      lVar9 = in_ST2;
      in_ST1 = in_ST3;
      in_ST2 = in_ST4;
      in_ST3 = in_ST5;
      in_ST4 = in_ST6;
      in_ST5 = lVar10;
      for (lVar5 = 0; lVar7 != lVar5; lVar5 = lVar5 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar5);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar5);
        lVar10 = in_ST0 * lVar8;
        in_ST0 = in_ST1;
        lVar8 = in_ST2;
        in_ST1 = in_ST4;
        in_ST2 = in_ST5;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar7);
        local_68 = lVar9 - ((longdouble)0 + lVar10);
        in_ST4 = in_ST5;
        lVar10 = in_ST5;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar7,lVar7,&local_68);
        lVar9 = in_ST3;
        in_ST3 = in_ST5;
        in_ST5 = lVar10;
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar7);
      in_ST6 = in_ST5;
      lVar12 = in_ST0;
      sqrtl();
      in_ST0 = lVar9;
      lVar10 = in_ST6;
      local_68 = lVar8;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,lVar7,lVar7,&local_68,in_R8,in_R9,lVar12);
      lVar6 = lVar7 + 1;
      local_48 = lVar6;
      for (; lVar5 = local_48, lVar6 < lVar4; lVar6 = lVar6 + 1) {
        lVar9 = in_ST2;
        lVar8 = in_ST3;
        lVar12 = in_ST5;
        in_ST2 = in_ST6;
        for (lVar5 = 0; p_Var1 = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24]
            , lVar7 != lVar5; lVar5 = lVar5 + 1) {
          (*p_Var1)(this,lVar7,lVar5);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar6,lVar5);
          lVar11 = in_ST0 * in_ST1;
          in_ST0 = lVar8;
          in_ST1 = in_ST4;
          lVar8 = in_ST2;
          in_ST4 = lVar10;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar6);
          local_78 = lVar9 - ((longdouble)0 + lVar11);
          in_ST2 = lVar10;
          lVar11 = lVar10;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar7,lVar6,&local_78);
          lVar9 = lVar12;
          lVar12 = lVar10;
          lVar10 = lVar11;
        }
        (*p_Var1)(this,lVar7,lVar7);
        lVar11 = ABS(in_ST0);
        in_ST0 = in_ST4;
        in_ST3 = in_ST2;
        lVar10 = in_ST2;
        if (lVar11 < local_3c) {
          Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
          in_ST0 = in_ST4;
        }
        in_ST4 = lVar10;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar6);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar7);
        local_78 = in_ST1 / lVar9;
        in_ST5 = in_ST4;
        in_ST6 = in_ST4;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar7,lVar6,&local_78);
        in_ST1 = lVar12;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar6);
        lVar10 = in_ST6;
        local_78 = lVar8;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar6,lVar7,&local_78);
      }
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky() {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {//diagonal elements
            TVar sum = 0;
            if constexpr (is_complex<TVar>::value){
                sum += GetVal(i,k)*std::conj(GetVal(i,k));
            }else{
                sum += GetVal(i,k)*GetVal(i,k);
            }
            PutVal( i,i,GetVal(i,i)-sum );
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {//off-diagonal elements
            for(int64_t k=0; k<i; k++) {
                TVar sum = 0.;
                if constexpr (is_complex<TVar>::value){
                    sum += GetVal(i,k)*std::conj(GetVal(j,k));
                }else{
                    sum += GetVal(i,k)*GetVal(j,k);
                }
                PutVal( i,j,GetVal(i,j)-sum);
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            if constexpr (is_complex<TVar>::value){
                PutVal(j,i,std::conj(GetVal(i,j)));
            }else{
                PutVal(j,i,GetVal(i,j));
            }
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
	
}